

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.h
# Opt level: O1

string * __thiscall Symbol::to_string_abi_cxx11_(string *__return_storage_ptr__,Symbol *this)

{
  ostream *poVar1;
  int type;
  stringstream osf;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  Token::get_typename_abi_cxx11_(&local_1c0,(Token *)(ulong)(uint)this->type,type);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t\t",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string to_string() const {
        stringstream osf;
        osf << Token::get_typename(type) << "\t\t" << name << endl;
        return osf.str();
    }